

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

tuple __thiscall
pybind11::make_tuple<(pybind11::return_value_policy)1,pybind11::str&>(pybind11 *this,str *args_)

{
  PyTypeObject *pPVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  handle *this_00;
  cast_error *__return_storage_ptr__;
  reference type;
  PyObject **ppPVar6;
  handle local_d0;
  iterator local_c8;
  value_type *arg_value;
  iterator __end0;
  iterator __begin0;
  array<pybind11::object,_1UL> *__range2;
  int counter;
  undefined1 *local_80;
  undefined1 local_78 [8];
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1UL>
  argtypes;
  size_t i;
  handle local_40;
  PyObject *local_38;
  pybind11 *local_30;
  array<pybind11::object,_1UL> local_28;
  array<pybind11::object,_1UL> args;
  size_t size;
  str *args__local;
  tuple *result;
  
  args._M_elems[0].super_handle.m_ptr = (_Type)(object)0x1;
  local_30 = (pybind11 *)&local_28;
  handle::handle(&local_40,(PyObject *)0x0);
  local_38 = (PyObject *)
             detail::pyobject_caster<pybind11::str>::cast
                       ((handle *)args_,automatic_reference,local_40);
  reinterpret_steal<pybind11::object>((pybind11 *)&local_28,(handle)local_38);
  argtypes._M_elems[0].field_2._8_8_ = 0;
  while( true ) {
    uVar2 = argtypes._M_elems[0].field_2._8_8_;
    sVar5 = std::array<pybind11::object,_1UL>::size(&local_28);
    if (sVar5 <= (ulong)uVar2) {
      __range2._6_1_ = 0;
      tuple::tuple<unsigned_long,_0>((tuple *)this,1);
      __range2._0_4_ = 0;
      __begin0 = local_28._M_elems;
      __end0 = std::array<pybind11::object,_1UL>::begin((array<pybind11::object,_1UL> *)__begin0);
      arg_value = std::array<pybind11::object,_1UL>::end((array<pybind11::object,_1UL> *)__begin0);
      while( true ) {
        if (__end0 == arg_value) {
          __range2._6_1_ = 1;
          std::array<pybind11::object,_1UL>::~array(&local_28);
          return (object)(object)this;
        }
        local_c8 = __end0;
        local_d0 = object::release(__end0);
        ppPVar6 = handle::ptr(&local_d0);
        pPVar1 = (PyTypeObject *)*ppPVar6;
        ppPVar6 = handle::ptr((handle *)this);
        iVar4 = ::PyType_HasFeature((*ppPVar6)->ob_type,0x4000000);
        if (iVar4 == 0) break;
        ppPVar6 = handle::ptr((handle *)this);
        (&(*ppPVar6)[1].ob_type)[(int)__range2] = pPVar1;
        __end0 = __end0 + 1;
        __range2._0_4_ = (int)__range2 + 1;
      }
      __assert_fail("PyTuple_Check(result.ptr())",
                    "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/pybind11/include/pybind11/cast.h"
                    ,0x40b,
                    "tuple pybind11::make_tuple(Args &&...) [policy = pybind11::return_value_policy::automatic_reference, Args = <pybind11::str &>]"
                   );
    }
    this_00 = &std::array<pybind11::object,_1UL>::operator[]
                         (&local_28,argtypes._M_elems[0].field_2._8_8_)->super_handle;
    bVar3 = handle::operator_cast_to_bool(this_00);
    if (!bVar3) break;
    argtypes._M_elems[0].field_2._8_8_ = argtypes._M_elems[0].field_2._8_8_ + 1;
  }
  local_80 = local_78;
  type_id<pybind11::str&>();
  __range2._7_1_ = 1;
  __return_storage_ptr__ = (cast_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string((string *)&counter,argtypes._M_elems[0].field_2._8_8_);
  type = std::
         array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1UL>
         ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1UL>
                       *)local_78,argtypes._M_elems[0].field_2._8_8_);
  cast_error_unable_to_convert_call_arg(__return_storage_ptr__,(string *)&counter,type);
  __range2._7_1_ = 0;
  __cxa_throw(__return_storage_ptr__,&cast_error::typeinfo,cast_error::~cast_error);
}

Assistant:

tuple make_tuple(Args&&... args_) {
    constexpr size_t size = sizeof...(Args);
    std::array<object, size> args {
        { reinterpret_steal<object>(detail::make_caster<Args>::cast(
            std::forward<Args>(args_), policy, nullptr))... }
    };
    for (size_t i = 0; i < args.size(); i++) {
        if (!args[i]) {
#if defined(NDEBUG)
            throw cast_error_unable_to_convert_call_arg();
#else
            std::array<std::string, size> argtypes { {type_id<Args>()...} };
            throw cast_error_unable_to_convert_call_arg(std::to_string(i), argtypes[i]);
#endif
        }
    }
    tuple result(size);
    int counter = 0;
    for (auto &arg_value : args)
        PyTuple_SET_ITEM(result.ptr(), counter++, arg_value.release().ptr());
    return result;
}